

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcAnnotationFillArea::~IfcAnnotationFillArea(IfcAnnotationFillArea *this)

{
  ~IfcAnnotationFillArea((IfcAnnotationFillArea *)&this[-1].InnerBoundaries.have);
  return;
}

Assistant:

IfcAnnotationFillArea() : Object("IfcAnnotationFillArea") {}